

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O3

VariableIndex __thiscall
cnn::ComputationGraph::add_const_parameters(ComputationGraph *this,Parameters *p)

{
  iterator __position;
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  long in_RDX;
  Node *local_28;
  
  __position._M_current = *(Node ***)(p->dim).d;
  *(int *)&(this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
           super__Vector_impl_data._M_start =
       (int)((ulong)((long)__position._M_current -
                    (long)(p->super_ParametersBase)._vptr_ParametersBase) >> 3);
  local_28 = (Node *)operator_new(0x80);
  (local_28->dim).nd = 0;
  (local_28->dim).bd = 1;
  (local_28->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_28->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_28->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28->_vptr_Node = (_func_int **)&PTR__Node_0028d7a0;
  pVVar1 = *(pointer *)(in_RDX + 0x10);
  pVVar2 = *(pointer *)(in_RDX + 0x18);
  pVVar3 = *(pointer *)(in_RDX + 0x20);
  local_28[1]._vptr_Node = *(_func_int ***)(in_RDX + 8);
  local_28[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = pVVar1;
  local_28[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = pVVar2;
  local_28[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pVVar3;
  local_28[1].dim.d[0] = *(uint *)(in_RDX + 0x28);
  *(long *)(local_28[1].dim.d + 2) = in_RDX;
  if (__position._M_current == *(Node ***)((p->dim).d + 2)) {
    std::vector<cnn::Node*,std::allocator<cnn::Node*>>::_M_realloc_insert<cnn::Node*>
              ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)p,__position,&local_28);
  }
  else {
    *__position._M_current = local_28;
    *(long *)(p->dim).d = *(long *)(p->dim).d + 8;
  }
  set_dim_for_new_node((ComputationGraph *)p,(VariableIndex *)this);
  return (VariableIndex)(uint)this;
}

Assistant:

VariableIndex ComputationGraph::add_const_parameters(Parameters* p) {
  VariableIndex new_node_index(nodes.size());
  ConstParameterNode* new_node = new ConstParameterNode(p);
  nodes.push_back(new_node);
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}